

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O2

void __thiscall
pbrt::FilmBaseParameters::FilmBaseParameters
          (FilmBaseParameters *this,ParameterDictionary *parameters,FilterHandle *filter,
          PixelSensor *sensor,FileLoc *loc)

{
  Bounds2i *b2;
  size_type sVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Bounds2<int> *pBVar7;
  Bounds2<float> *pBVar8;
  int iVar9;
  int iVar10;
  Tuple2<pbrt::Point2,_int> TVar11;
  int iVar12;
  Tuple2<pbrt::Point2,_int> TVar13;
  Tuple2<pbrt::Point2,_int> TVar14;
  Tuple2<pbrt::Point2,_int> TVar15;
  Tuple2<pbrt::Point2,_int> TVar16;
  undefined1 auVar17 [16];
  float fVar18;
  Float FVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  Bounds2<int> BVar25;
  Bounds2i newBounds;
  vector<int,_std::allocator<int>_> pb;
  vector<float,_std::allocator<float>_> cr;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  string local_70;
  string local_50;
  
  local_78 = &this->filename;
  (this->fullResolution).super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int> =
       (Tuple2<pbrt::Point2,_int>)0x7fffffff7fffffff;
  (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int> =
       (Tuple2<pbrt::Point2,_int>)0x8000000080000000;
  (this->filter).
  super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  .bits = 0;
  (this->filter).
  super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  .bits = (filter->
          super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
          ).bits;
  this->sensor = sensor;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"filename",&local_a9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_79);
  ParameterDictionary::GetOneString(&local_a8,parameters,&local_70,&local_50);
  std::__cxx11::string::operator=((string *)local_78,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  sVar1 = (this->filename)._M_string_length;
  if (*(long *)(Options + 0x30) == 0) {
    if (sVar1 == 0) {
      std::__cxx11::string::assign((char *)local_78);
    }
  }
  else {
    if (sVar1 != 0) {
      Warning<std::__cxx11::string&,std::__cxx11::string&>
                (loc,
                 "Output filename supplied on command line, \"%s\" will override filename provided in scene description file, \"%s\"."
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (Options + 0x28),local_78);
    }
    std::__cxx11::string::_M_assign((string *)local_78);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"xresolution",(allocator<char> *)&local_50);
  iVar4 = ParameterDictionary::GetOneInt(parameters,&local_a8,0x500);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"yresolution",&local_a9);
  iVar5 = ParameterDictionary::GetOneInt(parameters,&local_70,0x2d0);
  TVar11.y = iVar5;
  TVar11.x = iVar4;
  (this->fullResolution).super_Tuple2<pbrt::Point2,_int> = TVar11;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_a8);
  if (*(char *)(Options + 8) == '\x01') {
    auVar20._8_8_ = 0;
    auVar20._0_8_ = (this->fullResolution).super_Tuple2<pbrt::Point2,_int>;
    auVar22 = vpsrad_avx(auVar20,0x1f);
    auVar22 = vpsrld_avx(auVar22,0x1e);
    auVar22 = vpaddd_avx(auVar20,auVar22);
    auVar20 = vpsrad_avx(auVar22,2);
    auVar22._8_4_ = 1;
    auVar22._0_8_ = 0x100000001;
    auVar22._12_4_ = 1;
    auVar22 = vpmaxsd_avx512vl(auVar20,auVar22);
    (this->fullResolution).super_Tuple2<pbrt::Point2,_int> = auVar22._0_8_;
  }
  local_70._M_dataplus._M_p = (pointer)0x0;
  Bounds2<int>::Bounds2((Bounds2<int> *)&local_a8,(Point2<int> *)&local_70,&this->fullResolution);
  b2 = &this->pixelBounds;
  (b2->pMin).super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)local_a8._M_dataplus._M_p;
  (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int> =
       (Tuple2<pbrt::Point2,_int>)local_a8._M_string_length;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"pixelbounds",(allocator<char> *)&local_50);
  ParameterDictionary::GetIntArray
            ((vector<int,_std::allocator<int>_> *)&local_70,parameters,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (*(char *)(Options + 0xec) == '\x01') {
    pBVar7 = pstd::optional<pbrt::Bounds2<int>_>::value
                       ((optional<pbrt::Bounds2<int>_> *)(Options + 0xdc));
    local_a8._M_dataplus._M_p = *(pointer *)&(pBVar7->pMin).super_Tuple2<pbrt::Point2,_int>;
    local_a8._M_string_length = *(size_type *)&(pBVar7->pMax).super_Tuple2<pbrt::Point2,_int>;
    BVar25 = Intersect<int>((Bounds2<int> *)&local_a8,b2);
    if ((((int)local_a8._M_dataplus._M_p != BVar25.pMin.super_Tuple2<pbrt::Point2,_int>.x) ||
        (local_a8._M_dataplus._M_p._4_4_ != BVar25.pMin.super_Tuple2<pbrt::Point2,_int>.y)) ||
       (((int)local_a8._M_string_length != BVar25.pMax.super_Tuple2<pbrt::Point2,_int>.x ||
        (local_a8._M_string_length._4_4_ != BVar25.pMax.super_Tuple2<pbrt::Point2,_int>.y)))) {
      Warning(loc,"Supplied pixel bounds extend beyond image resolution. Clamping.");
    }
    BVar25 = Intersect<int>((Bounds2<int> *)&local_a8,b2);
    (this->pixelBounds).pMin = (Point2<int>)BVar25.pMin.super_Tuple2<pbrt::Point2,_int>;
    (this->pixelBounds).pMax = (Point2<int>)BVar25.pMax.super_Tuple2<pbrt::Point2,_int>;
    if (local_70._M_dataplus._M_p != (pointer)local_70._M_string_length) {
      Warning(loc,"Both pixel bounds and crop window were specified. Using the crop window.");
    }
  }
  else if (local_70._M_dataplus._M_p != (pointer)local_70._M_string_length) {
    if (local_70._M_string_length - (long)local_70._M_dataplus._M_p == 0x10) {
      iVar4 = *(int *)local_70._M_dataplus._M_p;
      iVar5 = *(int *)(local_70._M_dataplus._M_p + 4);
      iVar9 = *(int *)(local_70._M_dataplus._M_p + 8);
      iVar12 = *(int *)(local_70._M_dataplus._M_p + 0xc);
      iVar10 = iVar4;
      if (iVar5 < iVar4) {
        iVar10 = iVar5;
      }
      iVar6 = iVar9;
      if (iVar12 < iVar9) {
        iVar6 = iVar12;
      }
      local_a8._M_dataplus._M_p._4_4_ = iVar6;
      local_a8._M_dataplus._M_p._0_4_ = iVar10;
      if (iVar5 < iVar4) {
        iVar5 = iVar4;
      }
      if (iVar12 < iVar9) {
        iVar12 = iVar9;
      }
      local_a8._M_string_length._4_4_ = iVar12;
      local_a8._M_string_length._0_4_ = iVar5;
      BVar25 = Intersect<int>((Bounds2<int> *)&local_a8,b2);
      if (((((int)local_a8._M_dataplus._M_p != BVar25.pMin.super_Tuple2<pbrt::Point2,_int>.x) ||
           (local_a8._M_dataplus._M_p._4_4_ != BVar25.pMin.super_Tuple2<pbrt::Point2,_int>.y)) ||
          ((int)local_a8._M_string_length != BVar25.pMax.super_Tuple2<pbrt::Point2,_int>.x)) ||
         (local_a8._M_string_length._4_4_ != BVar25.pMax.super_Tuple2<pbrt::Point2,_int>.y)) {
        Warning(loc,"Supplied pixel bounds extend beyond image resolution. Clamping.");
      }
      BVar25 = Intersect<int>((Bounds2<int> *)&local_a8,b2);
      (this->pixelBounds).pMin = (Point2<int>)BVar25.pMin.super_Tuple2<pbrt::Point2,_int>;
      (this->pixelBounds).pMax = (Point2<int>)BVar25.pMax.super_Tuple2<pbrt::Point2,_int>;
    }
    else {
      local_a8._M_dataplus._M_p._0_4_ =
           (int)(local_70._M_string_length - (long)local_70._M_dataplus._M_p >> 2);
      Error<int>(loc,"%d values supplied for \"pixelbounds\". Expected 4.",(int *)&local_a8);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"cropwindow",&local_a9);
  ParameterDictionary::GetFloatArray
            ((vector<float,_std::allocator<float>_> *)&local_50,parameters,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (*(char *)(Options + 0xd8) == '\x01') {
    pBVar8 = pstd::optional<pbrt::Bounds2<float>_>::value
                       ((optional<pbrt::Bounds2<float>_> *)(Options + 200));
    fVar18 = (float)(this->fullResolution).super_Tuple2<pbrt::Point2,_int>.x;
    fVar24 = (float)(this->fullResolution).super_Tuple2<pbrt::Point2,_int>.y;
    auVar22 = ZEXT416((uint)(fVar18 * (pBVar8->pMin).super_Tuple2<pbrt::Point2,_float>.x));
    auVar22 = vroundss_avx(auVar22,auVar22,10);
    auVar20 = ZEXT416((uint)(fVar24 * (pBVar8->pMin).super_Tuple2<pbrt::Point2,_float>.y));
    auVar20 = vroundss_avx(auVar20,auVar20,10);
    iVar9 = (int)auVar22._0_4_;
    iVar12 = (int)auVar20._0_4_;
    auVar22 = ZEXT416((uint)(fVar18 * (pBVar8->pMax).super_Tuple2<pbrt::Point2,_float>.x));
    auVar22 = vroundss_avx(auVar22,auVar22,10);
    iVar5 = (int)auVar22._0_4_;
    iVar4 = iVar9;
    if (iVar5 < iVar9) {
      iVar4 = iVar5;
    }
    auVar22 = ZEXT416((uint)(fVar24 * (pBVar8->pMax).super_Tuple2<pbrt::Point2,_float>.y));
    auVar22 = vroundss_avx(auVar22,auVar22,10);
    iVar6 = (int)auVar22._0_4_;
    iVar10 = iVar12;
    if (iVar6 < iVar12) {
      iVar10 = iVar6;
    }
    TVar15.y = iVar10;
    TVar15.x = iVar4;
    if (iVar5 < iVar9) {
      iVar5 = iVar9;
    }
    (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int> = TVar15;
    if (iVar6 < iVar12) {
      iVar6 = iVar12;
    }
    TVar14.y = iVar6;
    TVar14.x = iVar5;
    (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int> = TVar14;
    if (local_50._M_dataplus._M_p != (pointer)local_50._M_string_length) {
      Warning(loc,
              "Crop window supplied on command line will override crop window specified with Film.")
      ;
    }
    if ((*(char *)(Options + 0xec) != '\0') ||
       (local_70._M_dataplus._M_p != (pointer)local_70._M_string_length)) {
      Warning(loc,"Both pixel bounds and crop window were specified. Using the crop window.");
    }
  }
  else if (local_50._M_dataplus._M_p != (pointer)local_50._M_string_length) {
    if (*(char *)(Options + 0xec) == '\x01') {
      Warning(loc,"Ignoring \"cropwindow\" since pixel bounds were specified on the command line.");
    }
    else if (local_50._M_string_length - (long)local_50._M_dataplus._M_p == 0x10) {
      if (local_70._M_dataplus._M_p != (pointer)local_70._M_string_length) {
        Warning(loc,"Both pixel bounds and crop window were specified. Using the crop window.");
      }
      auVar22 = *(undefined1 (*) [16])local_50._M_dataplus._M_p;
      auVar20 = vshufps_avx(auVar22,auVar22,0xb1);
      uVar3 = vcmpps_avx512vl(auVar22,auVar20,1);
      auVar20 = vmovsldup_avx(auVar22);
      auVar22 = vmovshdup_avx512vl(auVar22);
      bVar2 = (bool)((byte)uVar3 & 1);
      auVar17._0_4_ = (uint)bVar2 * auVar22._0_4_ | (uint)!bVar2 * auVar20._0_4_;
      bVar2 = (bool)((byte)(uVar3 >> 1) & 1);
      auVar17._4_4_ = (uint)bVar2 * auVar22._4_4_ | (uint)!bVar2 * auVar20._4_4_;
      bVar2 = (bool)((byte)(uVar3 >> 2) & 1);
      auVar17._8_4_ = (uint)bVar2 * auVar22._8_4_ | (uint)!bVar2 * auVar20._8_4_;
      bVar2 = (bool)((byte)(uVar3 >> 3) & 1);
      auVar17._12_4_ = (uint)bVar2 * auVar22._12_4_ | (uint)!bVar2 * auVar20._12_4_;
      uVar3 = vcmpps_avx512vl(auVar17,ZEXT816(0) << 0x40,1);
      auVar20 = vmovshdup_avx(auVar17);
      auVar21 = vshufps_avx(auVar17,auVar17,0xff);
      auVar23 = SUB6416(ZEXT464(0x3f800000),0);
      auVar22 = vminss_avx(auVar23,auVar17);
      auVar17 = vshufpd_avx(auVar17,auVar17,1);
      auVar20 = vminss_avx(auVar23,auVar20);
      auVar21 = vminss_avx(auVar23,auVar21);
      auVar17 = vminss_avx(auVar23,auVar17);
      fVar24 = (float)(this->fullResolution).super_Tuple2<pbrt::Point2,_int>.x;
      auVar20 = ZEXT416((uint)((float)((uint)!(bool)((byte)(uVar3 >> 1) & 1) * auVar20._0_4_) *
                              fVar24));
      auVar20 = vroundss_avx(auVar20,auVar20,10);
      iVar12 = (int)auVar20._0_4_;
      fVar18 = (float)(this->fullResolution).super_Tuple2<pbrt::Point2,_int>.y;
      auVar22 = ZEXT416((uint)((float)((uint)!(bool)((byte)uVar3 & 1) * auVar22._0_4_) * fVar24));
      auVar22 = vroundss_avx(auVar22,auVar22,10);
      auVar20 = ZEXT416((uint)((float)((uint)!(bool)((byte)(uVar3 >> 3) & 1) * auVar21._0_4_) *
                              fVar18));
      auVar20 = vroundss_avx(auVar20,auVar20,10);
      iVar5 = (int)auVar22._0_4_;
      auVar22 = ZEXT416((uint)((float)((uint)!(bool)((byte)(uVar3 >> 2) & 1) * auVar17._0_4_) *
                              fVar18));
      auVar22 = vroundss_avx(auVar22,auVar22,10);
      iVar10 = (int)auVar20._0_4_;
      iVar9 = (int)auVar22._0_4_;
      iVar4 = iVar12;
      if (iVar5 < iVar12) {
        iVar4 = iVar5;
      }
      iVar6 = iVar10;
      if (iVar9 < iVar10) {
        iVar6 = iVar9;
      }
      TVar16.y = iVar6;
      TVar16.x = iVar4;
      if (iVar5 < iVar12) {
        iVar5 = iVar12;
      }
      (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int> = TVar16;
      if (iVar9 < iVar10) {
        iVar9 = iVar10;
      }
      TVar13.y = iVar9;
      TVar13.x = iVar5;
      (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int> = TVar13;
    }
    else {
      local_a8._M_dataplus._M_p._0_4_ =
           (int)(local_50._M_string_length - (long)local_50._M_dataplus._M_p >> 2);
      Error<int>(loc,"%d values supplied for \"cropwindow\". Expected 4.",(int *)&local_a8);
    }
  }
  auVar21._8_8_ = 0;
  auVar21._0_8_ = (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>;
  uVar3 = vpcmpd_avx512vl(auVar21,auVar23,5);
  if ((uVar3 & 3) == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"diagonal",&local_a9);
    FVar19 = ParameterDictionary::GetOneFloat(parameters,&local_a8,35.0);
    this->diagonal = FVar19;
    std::__cxx11::string::~string((string *)&local_a8);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&local_50);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_70);
    return;
  }
  ErrorExit<pbrt::Bounds2<int>&>(loc,"Degenerate pixel bounds provided to film: %s.",b2);
}

Assistant:

FilmBaseParameters::FilmBaseParameters(const ParameterDictionary &parameters,
                                       FilterHandle filter, const PixelSensor *sensor,
                                       const FileLoc *loc)
    : filter(filter), sensor(sensor) {
    filename = parameters.GetOneString("filename", "");
    if (!Options->imageFile.empty()) {
        if (!filename.empty())
            Warning(loc,
                    "Output filename supplied on command line, \"%s\" will "
                    "override "
                    "filename provided in scene description file, \"%s\".",
                    Options->imageFile, filename);
        filename = Options->imageFile;
    } else if (filename.empty())
        filename = "pbrt.exr";

    fullResolution = Point2i(parameters.GetOneInt("xresolution", 1280),
                             parameters.GetOneInt("yresolution", 720));
    if (Options->quickRender) {
        fullResolution.x = std::max(1, fullResolution.x / 4);
        fullResolution.y = std::max(1, fullResolution.y / 4);
    }

    pixelBounds = Bounds2i(Point2i(0, 0), fullResolution);
    std::vector<int> pb = parameters.GetIntArray("pixelbounds");
    if (Options->pixelBounds) {
        Bounds2i newBounds = *Options->pixelBounds;
        if (Intersect(newBounds, pixelBounds) != newBounds)
            Warning(loc, "Supplied pixel bounds extend beyond image "
                         "resolution. Clamping.");
        pixelBounds = Intersect(newBounds, pixelBounds);

        if (!pb.empty())
            Warning(loc, "Both pixel bounds and crop window were specified. Using the "
                         "crop window.");
    } else if (!pb.empty()) {
        if (pb.size() != 4)
            Error(loc, "%d values supplied for \"pixelbounds\". Expected 4.",
                  int(pb.size()));
        else {
            Bounds2i newBounds = Bounds2i({pb[0], pb[2]}, {pb[1], pb[3]});
            if (Intersect(newBounds, pixelBounds) != newBounds)
                Warning(loc, "Supplied pixel bounds extend beyond image "
                             "resolution. Clamping.");
            pixelBounds = Intersect(newBounds, pixelBounds);
        }
    }

    std::vector<Float> cr = parameters.GetFloatArray("cropwindow");
    if (Options->cropWindow) {
        Bounds2f crop = *Options->cropWindow;
        // Compute film image bounds
        pixelBounds = Bounds2i(Point2i(std::ceil(fullResolution.x * crop.pMin.x),
                                       std::ceil(fullResolution.y * crop.pMin.y)),
                               Point2i(std::ceil(fullResolution.x * crop.pMax.x),
                                       std::ceil(fullResolution.y * crop.pMax.y)));

        if (!cr.empty())
            Warning(loc, "Crop window supplied on command line will override "
                         "crop window specified with Film.");
        if (Options->pixelBounds || !pb.empty())
            Warning(loc, "Both pixel bounds and crop window were specified. Using the "
                         "crop window.");
    } else if (!cr.empty()) {
        if (Options->pixelBounds)
            Warning(loc, "Ignoring \"cropwindow\" since pixel bounds were specified "
                         "on the command line.");
        else if (cr.size() == 4) {
            if (!pb.empty())
                Warning(loc, "Both pixel bounds and crop window were "
                             "specified. Using the "
                             "crop window.");

            Bounds2f crop;
            crop.pMin.x = Clamp(std::min(cr[0], cr[1]), 0.f, 1.f);
            crop.pMax.x = Clamp(std::max(cr[0], cr[1]), 0.f, 1.f);
            crop.pMin.y = Clamp(std::min(cr[2], cr[3]), 0.f, 1.f);
            crop.pMax.y = Clamp(std::max(cr[2], cr[3]), 0.f, 1.f);

            // Compute film image bounds
            pixelBounds = Bounds2i(Point2i(std::ceil(fullResolution.x * crop.pMin.x),
                                           std::ceil(fullResolution.y * crop.pMin.y)),
                                   Point2i(std::ceil(fullResolution.x * crop.pMax.x),
                                           std::ceil(fullResolution.y * crop.pMax.y)));
        } else
            Error(loc, "%d values supplied for \"cropwindow\". Expected 4.",
                  (int)cr.size());
    }

    if (pixelBounds.IsEmpty())
        ErrorExit(loc, "Degenerate pixel bounds provided to film: %s.", pixelBounds);

    diagonal = parameters.GetOneFloat("diagonal", 35.);
}